

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O1

void Gudhi::persistence_matrix::swap
               (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>
                *col1,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_true>_>_>
                      *col2)

{
  Index IVar1;
  Dimension DVar2;
  Row_container *pRVar3;
  Field_operators *pFVar4;
  Entry_constructor *pEVar5;
  
  pRVar3 = (col1->super_Row_access_option).rows_;
  (col1->super_Row_access_option).rows_ = (col2->super_Row_access_option).rows_;
  (col2->super_Row_access_option).rows_ = pRVar3;
  IVar1 = (col1->super_Row_access_option).columnIndex_;
  (col1->super_Row_access_option).columnIndex_ = (col2->super_Row_access_option).columnIndex_;
  (col2->super_Row_access_option).columnIndex_ = IVar1;
  DVar2 = (col1->super_Column_dimension_option).dim_;
  (col1->super_Column_dimension_option).dim_ = (col2->super_Column_dimension_option).dim_;
  (col2->super_Column_dimension_option).dim_ = DVar2;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes((node_ptr)&col1->column_,(node_ptr)&col2->column_);
  pFVar4 = col1->operators_;
  col1->operators_ = col2->operators_;
  col2->operators_ = pFVar4;
  pEVar5 = col1->entryPool_;
  col1->entryPool_ = col2->entryPool_;
  col2->entryPool_ = pEVar5;
  return;
}

Assistant:

void swap(Intrusive_list_column& col1, Intrusive_list_column& col2) {
    swap(static_cast<typename Master_matrix::Row_access_option&>(col1),
         static_cast<typename Master_matrix::Row_access_option&>(col2));
    swap(static_cast<typename Master_matrix::Column_dimension_option&>(col1),
         static_cast<typename Master_matrix::Column_dimension_option&>(col2));
    swap(static_cast<typename Master_matrix::Chain_column_option&>(col1),
         static_cast<typename Master_matrix::Chain_column_option&>(col2));
    col1.column_.swap(col2.column_);
    std::swap(col1.operators_, col2.operators_);
    std::swap(col1.entryPool_, col2.entryPool_);
  }